

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O0

void htmlentities_append(bc_string_t *str,char c)

{
  char *suffix;
  char *e;
  char c_local;
  bc_string_t *str_local;
  
  suffix = htmlentities(c);
  if (suffix == (char *)0x0) {
    bc_string_append_c(str,c);
  }
  else {
    bc_string_append(str,suffix);
  }
  return;
}

Assistant:

static void
htmlentities_append(bc_string_t *str, char c)
{
    const char *e = htmlentities(c);
    if (e == NULL)
        bc_string_append_c(str, c);
    else
        bc_string_append(str, e);
}